

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Constraint.cpp
# Opt level: O0

RealType __thiscall
QuantLib::Constraint::update
          (Constraint *this,DynamicVector<double,_std::allocator<double>_> *params,
          DynamicVector<double,_std::allocator<double>_> *direction,RealType beta)

{
  DynamicVector<double,_std::allocator<double>_> *in_RSI;
  DynamicVector<double,_std::allocator<double>_> *in_RDI;
  double in_XMM0_Qa;
  int icount;
  bool valid;
  DynamicVector<double,_std::allocator<double>_> newParams;
  RealType diff;
  DynamicVector<double,_std::allocator<double>_> *in_stack_fffffffffffffef8;
  Constraint *in_stack_ffffffffffffff00;
  Constraint local_88;
  int local_6c;
  bool local_65;
  double local_28;
  
  local_28 = in_XMM0_Qa;
  OpenMD::operator*((double)in_RSI,in_RDI);
  OpenMD::operator+(in_RSI,in_RDI);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x2e7c2d);
  local_65 = test(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  local_6c = 0;
  while (((local_65 ^ 0xffU) & 1) != 0) {
    if (200 < local_6c) {
      snprintf(painCave.errMsg,2000,"can\'t update parameter vector\n");
      painCave.isFatal = 1;
      painCave.severity = 1;
      simError();
    }
    local_28 = local_28 * 0.5;
    local_6c = local_6c + 1;
    OpenMD::operator*((double)in_RSI,in_RDI);
    OpenMD::operator+(in_RSI,in_RDI);
    in_stack_ffffffffffffff00 = &local_88;
    OpenMD::DynamicVector<double,_std::allocator<double>_>::operator=
              ((DynamicVector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00,
               in_stack_fffffffffffffef8);
    OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
              ((DynamicVector<double,_std::allocator<double>_> *)0x2e7d9a);
    OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
              ((DynamicVector<double,_std::allocator<double>_> *)0x2e7da4);
    local_65 = test(in_stack_ffffffffffffff00,in_stack_fffffffffffffef8);
  }
  OpenMD::operator*((double)in_RSI,in_RDI);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::operator+=
            ((DynamicVector<double,_std::allocator<double>_> *)in_stack_ffffffffffffff00,
             in_stack_fffffffffffffef8);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x2e7e29);
  OpenMD::DynamicVector<double,_std::allocator<double>_>::~DynamicVector
            ((DynamicVector<double,_std::allocator<double>_> *)0x2e7e44);
  return local_28;
}

Assistant:

RealType Constraint::update(DynamicVector<RealType>& params,
                              const DynamicVector<RealType>& direction,
                              RealType beta) {
    RealType diff                     = beta;
    DynamicVector<RealType> newParams = params + diff * direction;
    bool valid                        = test(newParams);
    int icount                        = 0;
    while (!valid) {
      if (icount > 200) {
        snprintf(painCave.errMsg, MAX_SIM_ERROR_MSG_LENGTH,
                 "can't update parameter vector\n");
        painCave.isFatal  = 1;
        painCave.severity = OPENMD_ERROR;
        simError();
      }
      diff *= 0.5;
      icount++;
      newParams = params + diff * direction;
      valid     = test(newParams);
    }
    params += diff * direction;
    return diff;
  }